

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

bool __thiscall branch_and_reduce_algorithm::lpReduction(branch_and_reduce_algorithm *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pvVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer piVar12;
  int *piVar13;
  bool bVar14;
  FILE *__stream;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int *piVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  string local_50;
  
  uVar1 = this->rn;
  updateLP(this);
  iVar20 = this->n;
  if (0 < iVar20) {
    lVar22 = 0;
    do {
      if ((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar22] < 0) {
        piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar2 = piVar5[lVar22];
        if ((iVar2 == (this->used).uid) && (piVar5[(int)lVar22 + iVar20] != iVar2)) {
          set(this,(int)lVar22,0);
          iVar20 = this->n;
        }
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar20);
  }
  iVar20 = (this->used).uid;
  (this->used).uid = iVar20 + 1;
  if (iVar20 < -1) {
    piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar22 != 0) {
      uVar16 = 0;
      do {
        piVar5[uVar16] = 0;
        uVar16 = uVar16 + 1;
      } while ((uVar16 & 0xffffffff) < (ulong)(lVar22 >> 2));
    }
    (this->used).uid = 1;
  }
  local_50._M_dataplus._M_p._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iter,
             (long)(this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(value_type_conflict1 *)&local_50);
  if (this->n < 1) {
    uVar15 = 0;
  }
  else {
    piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar6 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = 0;
    uVar15 = 0;
    do {
      if ((piVar5[lVar22] < 0) &&
         (iVar20 = (this->used).uid, iVar2 = piVar7[lVar22], piVar7[lVar22] = iVar20,
         iVar2 != iVar20)) {
        *piVar6 = (int)lVar22;
        pvVar8 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->in).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          iVar20 = piVar6[uVar16];
          if (iVar20 < this->n) {
            lVar17 = *(long *)&pvVar8[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data;
            piVar12 = *(pointer *)
                       ((long)&pvVar8[iVar20].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8);
            iVar2 = piVar10[iVar20];
            while (iVar2 < (int)((ulong)((long)piVar12 - lVar17) >> 2)) {
              iVar3 = this->n;
              piVar10[iVar20] = iVar2 + 1;
              uVar21 = (long)*(int *)(lVar17 + (long)iVar2 * 4) + (long)iVar3;
              iVar2 = iVar2 + 1;
              if (piVar5[(long)(int)uVar21 - (long)this->n] < 0) {
                iVar2 = (this->used).uid;
                iVar3 = piVar7[uVar21];
                piVar7[uVar21] = iVar2;
                if (iVar3 != iVar2) goto LAB_0010b9e3;
                iVar2 = piVar10[iVar20];
              }
            }
LAB_0010b9f6:
            lVar17 = (long)(int)uVar15;
            uVar15 = uVar15 + 1;
            piVar11[lVar17] = iVar20;
            uVar19 = (int)uVar16 - 1;
          }
          else {
            iVar2 = piVar9[iVar20 - this->n];
            iVar3 = (this->used).uid;
            iVar4 = piVar7[iVar2];
            piVar7[iVar2] = iVar3;
            if (iVar4 == iVar3) goto LAB_0010b9f6;
            uVar21 = (ulong)(uint)piVar9[(long)iVar20 - (long)this->n];
LAB_0010b9e3:
            if ((int)uVar21 < 0) goto LAB_0010b9f6;
            uVar19 = (int)uVar16 + 1;
            piVar6[uVar16 + 1] = (int)uVar21;
          }
          uVar16 = (ulong)uVar19;
        } while (-1 < (int)uVar19);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < this->n);
  }
  iVar20 = (this->used).uid;
  (this->used).uid = iVar20 + 1;
  if (iVar20 < -1) {
    piVar5 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar22 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar5;
    if (lVar22 != 0) {
      uVar16 = 0;
      do {
        piVar5[uVar16] = 0;
        uVar16 = uVar16 + 1;
      } while ((uVar16 & 0xffffffff) < (ulong)(lVar22 >> 2));
    }
    (this->used).uid = 1;
  }
  if (0 < (int)uVar15) {
    piVar5 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (ulong)uVar15;
    do {
      iVar20 = piVar6[uVar16 - 1];
      iVar2 = (this->used).uid;
      iVar3 = piVar7[iVar20];
      piVar7[iVar20] = iVar2;
      if (iVar3 != iVar2) {
        *piVar5 = piVar6[uVar16 - 1];
        pvVar8 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        piVar9 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar10 = (this->out).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar20 = 1;
        lVar22 = 0;
        do {
          iVar2 = piVar5[lVar22];
          iVar3 = this->n;
          if (iVar2 < iVar3) {
            iVar4 = (this->used).uid;
            lVar17 = (long)piVar10[iVar2] + (long)iVar3;
            iVar3 = piVar7[lVar17];
            piVar7[lVar17] = iVar4;
            if (iVar3 != iVar4) {
              lVar17 = (long)iVar20;
              iVar20 = iVar20 + 1;
              piVar5[lVar17] = piVar10[iVar2] + this->n;
            }
          }
          else {
            piVar13 = *(pointer *)
                       ((long)&pvVar8[iVar2 - iVar3].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data + 8);
            for (piVar18 = pvVar8[iVar2 - iVar3].super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start; piVar18 != piVar13;
                piVar18 = piVar18 + 1) {
              iVar2 = *piVar18;
              if ((piVar9[iVar2] < 0) &&
                 (iVar3 = (this->used).uid, iVar4 = piVar7[iVar2], piVar7[iVar2] = iVar3,
                 iVar4 != iVar3)) {
                lVar17 = (long)iVar20;
                iVar20 = iVar20 + 1;
                piVar5[lVar17] = iVar2;
              }
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < iVar20);
      }
      bVar14 = 1 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar14);
  }
  __stream = _stderr;
  uVar15 = this->rn;
  if ((2 < debug) && (uVar1 != uVar15 && this->depth <= this->maxDepth)) {
    debugString_abi_cxx11_(&local_50,this);
    fprintf(__stream,"%sLP: %d -> %d\n",
            CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),(ulong)uVar1,
            (ulong)(uint)this->rn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
                      local_50.field_2._M_allocated_capacity + 1);
    }
    uVar15 = this->rn;
  }
  return uVar1 != uVar15;
}

Assistant:

bool branch_and_reduce_algorithm::lpReduction()
{
    int oldn = rn;
    updateLP();

#if 1
    for (int v = 0; v < n; v++)
    {
        if (x[v] < 0 && used.get(v) && !used.get(n + v))
            set(v, 0);
    }
    used.clear();
    int p = 0;
    iter.assign(iter.size(), 0);
    for (int s = 0; s < n; s++)
        if (x[s] < 0 && used.add(s))
        {
            int qt = 0;
            que[qt] = s;
            while (qt >= 0)
            {
                int v = que[qt], u = -1;
                if (v < n)
                {
                    while (iter[v] < static_cast<int>(adj[v].size()))
                    {
                        u = n + adj[v][iter[v]++];
                        if (x[u - n] < 0 && used.add(u))
                        {
                            break;
                        }
                        u = -1;
                    }
                }
                else if (used.add(in[v - n]))
                {
                    u = in[v - n];
                }
                if (u >= 0)
                {
                    que[++qt] = u;
                }
                else
                {
                    level[p++] = v;
                    qt--;
                }
            }
        }
    used.clear();
    for (int i = p - 1; i >= 0; i--)
        if (used.add(level[i]))
        {
            int v = level[i];
            int qs = 0, qt = 0;
            que[qt++] = v;
            bool ok = true;
            while (qs < qt)
            {
                v = que[qs++];
                if (used.get(v >= n ? (v - n) : (v + n)))
                    ok = false;
                if (v >= n)
                {
                    for (int u : adj[v - n])
                        if (x[u] < 0 && used.add(u))
                        {
                            que[qt++] = u;
                        }
                }
                else if (used.add(n + out[v]))
                {
                    que[qt++] = n + out[v];
                }
            }
            ok = false;
            if (ok)
            {
                for (int j = 0; j < qt; j++)
                {
                    v = que[j];
                    if (v >= n)
                        set(v - n, 0);
                }
            }
        }

#endif // 0
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sLP: %d -> %d\n", debugString().c_str(), oldn, rn);
    return oldn != rn;
}